

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapter.h
# Opt level: O1

double __thiscall
bgui::ImageAdapter<unsigned_short>::getIntensityOfPixel
          (ImageAdapter<unsigned_short> *this,long x,long y)

{
  double dVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  ImageAdapterBase *pIVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  bool bVar11;
  double dVar12;
  SVector<long,_2> p;
  long local_18 [3];
  
  dVar12 = (this->super_ImageAdapterBase).scale;
  dVar1 = this->vmin;
  pIVar5 = &this->super_ImageAdapterBase;
  local_18[0] = (long)((double)x / dVar12);
  local_18[1] = (long)((double)y / dVar12);
  local_18[2] = 1;
  p.v[0] = 0;
  p.v[1] = 0;
  lVar10 = 0;
  do {
    lVar7 = p.v[lVar10];
    lVar8 = 0;
    do {
      lVar7 = lVar7 + local_18[lVar8] * (pIVar5->R).v[0][lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    p.v[lVar10] = lVar7;
    pIVar5 = (ImageAdapterBase *)(pIVar5->R).v;
    bVar11 = lVar10 == 0;
    lVar10 = lVar10 + 1;
  } while (bVar11);
  dVar12 = dVar1 + -1.0;
  iVar2 = this->image->depth;
  iVar3 = (this->super_ImageAdapterBase).channel;
  iVar9 = 0;
  if (-1 < iVar3 && iVar3 < iVar2) {
    iVar9 = iVar3;
  }
  iVar6 = iVar2 + -1;
  if (-1 < iVar3 && iVar3 < iVar2) {
    iVar6 = iVar3;
  }
  if (iVar9 <= iVar6) {
    lVar10 = 0;
    do {
      dVar4 = (double)this->image->img[iVar9 + lVar10][p.v[1]][p.v[0]];
      if (dVar4 <= dVar12) {
        dVar4 = dVar12;
      }
      dVar12 = dVar4;
      lVar10 = lVar10 + 1;
    } while ((iVar6 - iVar9) + 1 != (int)lVar10);
  }
  if (this->vmax < dVar12 || dVar12 < dVar1) {
    dVar12 = INFINITY;
  }
  return dVar12;
}

Assistant:

double getIntensityOfPixel(long x, long y) const
    {
      double ret=vmin-1;

      x=static_cast<long>(x/scale);
      y=static_cast<long>(y/scale);

      gmath::SVector<long, 2> p=R*gmath::SVector<long, 3>(x, y, 1);

      int dmin=0;
      int dmax=image->getDepth()-1;

      if (channel >= 0 && channel < image->getDepth())
      {
        dmin=dmax=channel;
      }

      for (int d=dmin; d<=dmax; d++)
      {
        if (image->get(p[0], p[1], d) > ret)
        {
          ret=image->get(p[0], p[1], d);
        }
      }

      if (ret < vmin || ret > vmax)
      {
        ret=std::numeric_limits<double>::infinity();
      }

      return ret;
    }